

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall depspawn::internal::ThreadPool::launch_theads(ThreadPool *this)

{
  void *in_RSI;
  
  if (this->nthreads_in_use_ != 0) {
    wait(this,in_RSI);
    std::mutex::lock(&this->mutex_);
    this->ready_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    std::condition_variable::notify_all();
    return;
  }
  return;
}

Assistant:

void launch_theads()
  {
    if (nthreads_in_use_) {
      wait();
      {
        std::lock_guard<std::mutex> my_guard_lock(mutex_);
        ready_ = true;
      }
      cond_var_.notify_all();
    }
  }